

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O0

void __thiscall
TPZDohrAssembly<std::complex<double>_>::Write
          (TPZDohrAssembly<std::complex<double>_> *this,TPZStream *buf,int withclassid)

{
  int64_t iVar1;
  TPZVec<int> *in_RSI;
  TPZStream *in_RDI;
  int nc;
  int ncoarse;
  int f;
  int nfine;
  TPZVec<int> *in_stack_ffffffffffffffc8;
  int local_24;
  int local_20;
  int local_1c;
  int local_18 [2];
  TPZVec<int> *local_10;
  
  local_10 = in_RSI;
  iVar1 = TPZVec<TPZVec<int>_>::size((TPZVec<TPZVec<int>_> *)(in_RDI + 1));
  local_18[0] = (int)iVar1;
  (*local_10->_vptr_TPZVec[3])(local_10,local_18,1);
  for (local_1c = 0; local_1c < local_18[0]; local_1c = local_1c + 1) {
    in_stack_ffffffffffffffc8 = local_10;
    TPZVec<TPZVec<int>_>::operator[]((TPZVec<TPZVec<int>_> *)(in_RDI + 1),(long)local_1c);
    TPZStream::Write<int>(in_RDI,in_stack_ffffffffffffffc8);
  }
  iVar1 = TPZVec<TPZVec<int>_>::size((TPZVec<TPZVec<int>_> *)(in_RDI + 5));
  local_20 = (int)iVar1;
  (*local_10->_vptr_TPZVec[3])(local_10,&local_20,1);
  for (local_24 = 0; local_24 < local_20; local_24 = local_24 + 1) {
    TPZVec<TPZVec<int>_>::operator[]((TPZVec<TPZVec<int>_> *)(in_RDI + 5),(long)local_24);
    TPZStream::Write<int>(in_RDI,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::Write(TPZStream &buf, int withclassid) const
{
    int nfine = fFineEqs.size();
    buf.Write(&nfine,1);
    for (int f=0; f<nfine; f++) {
        buf.Write( fFineEqs[f]);
    }
    int ncoarse = fCoarseEqs.size();
    buf.Write(&ncoarse,1);
    for (int nc=0; nc<ncoarse; nc++) {
        buf.Write( fCoarseEqs[nc]);
    }
}